

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanup
          (ThreadSafeArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  __pointer_type pAVar1;
  __pointer_type pcVar2;
  long lVar3;
  ArenaAlign AVar4;
  CleanupNode *pCVar5;
  string *extraout_RAX;
  SerialArena *pSVar6;
  CleanupNode *pCVar7;
  string *psVar8;
  __pointer_type pAVar9;
  CleanupNode *destructor_00;
  CleanupNode *pCVar10;
  undefined8 uVar11;
  size_t align_00;
  undefined8 uVar12;
  __pointer_type pAVar13;
  string *psVar14;
  ThreadSafeArena *this_00;
  char *pcVar15;
  string *elem;
  void *pvVar16;
  LogMessageFatal aLStack_88 [16];
  SerialArena *pSStack_78;
  size_t sStack_70;
  ulong uStack_68;
  string *psStack_60;
  _func_void_void_ptr *p_Stack_58;
  CleanupNode *pCStack_50;
  
  pCStack_50 = (CleanupNode *)0x1c4cb2;
  psVar8 = (string *)n;
  lVar3 = __tls_get_addr(&PTR_004d49d0);
  if (*(uint64_t *)(lVar3 + 8) != this->tag_and_id_) {
    pvVar16 = AllocateAlignedWithCleanupFallback(this,n,align,destructor);
    return pvVar16;
  }
  pSVar6 = *(SerialArena **)(lVar3 + 0x10);
  pCStack_50 = (CleanupNode *)0x1c4ccb;
  AVar4 = ArenaAlignAs(align);
  pcVar2 = (pSVar6->ptr_)._M_b._M_p;
  if (((ulong)pcVar2 & 7) != 0) {
    pCStack_50 = (CleanupNode *)0x1c4dcc;
    AllocateAlignedWithCleanup();
LAB_001c4dcc:
    pvVar16 = SerialArena::AllocateAlignedWithCleanupFallback(pSVar6,n,align,destructor);
    return pvVar16;
  }
  n = n + 7 & 0xfffffffffffffff8;
  elem = (string *)(-AVar4.align & (ulong)(pcVar2 + (AVar4.align - 1)));
  pCVar7 = (CleanupNode *)(elem + n);
  if ((CleanupNode *)pSVar6->limit_ < pCVar7) goto LAB_001c4dcc;
  (pSVar6->ptr_)._M_b._M_p = (__pointer_type)pCVar7;
  pCVar5 = (pSVar6->cleanup_list_).next_;
  if ((pSVar6->cleanup_list_).limit_ <= pCVar5) goto LAB_001c4df5;
  (pSVar6->cleanup_list_).next_ = pCVar5 + 1;
  pCVar5->elem = elem;
  pCVar5->destructor = destructor;
  while ((pCVar5 = (CleanupNode *)(pSVar6->cleanup_list_).prefetch_ptr_,
         pCVar5 != (CleanupNode *)0x0 && (pCVar5 < (CleanupNode *)(pSVar6->cleanup_list_).head_))) {
    pCStack_50 = (CleanupNode *)0x1c4df5;
    AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
LAB_001c4df5:
    pCStack_50 = (CleanupNode *)0x1c4e07;
    psVar8 = elem;
    cleanup::ChunkList::AddFallback(&pSVar6->cleanup_list_,elem,destructor,pSVar6);
  }
  pCVar10 = (pSVar6->cleanup_list_).next_;
  destructor_00 = (CleanupNode *)((long)pCVar5 - (long)pCVar10);
  if (((long)destructor_00 < 0x181) &&
     (destructor_00 = (pSVar6->cleanup_list_).limit_, pCVar5 < destructor_00)) {
    if (pCVar10 < pCVar5) {
      pCVar10 = pCVar5;
    }
    pCVar5 = pCVar10;
    if (pCVar5 != (CleanupNode *)0x0) {
      if (pCVar5 + 0x18 < destructor_00) {
        destructor_00 = pCVar5 + 0x18;
      }
      for (; pCVar5 < destructor_00; pCVar5 = pCVar5 + 4) {
      }
      goto LAB_001c4d48;
    }
LAB_001c4eab:
    pCStack_50 = (CleanupNode *)0x1c4eb5;
    AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
  }
  else {
LAB_001c4d48:
    (pSVar6->cleanup_list_).prefetch_ptr_ = (char *)pCVar5;
    psVar14 = (string *)(pSVar6->ptr_)._M_b._M_p;
    if ((string *)pSVar6->limit_ < psVar14) {
      pCStack_50 = (CleanupNode *)0x1c4e55;
      psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<char_const*,char_const*>
                         (pSVar6->limit_,(char *)psVar14,"limit_ >= ptr()");
    }
    else {
      psVar8 = (string *)0x0;
    }
    if (psVar8 != (string *)0x0) {
LAB_001c4e9e:
      pCStack_50 = (CleanupNode *)0x1c4eab;
      AllocateAlignedWithCleanup();
      goto LAB_001c4eab;
    }
    destructor_00 = (CleanupNode *)pSVar6->prefetch_ptr_;
    if ((destructor_00 != (CleanupNode *)0x0) &&
       (destructor_00 < (CleanupNode *)(pSVar6->head_)._M_b._M_p)) {
      pCStack_50 = (CleanupNode *)0x1c4e9e;
      AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
      psVar8 = extraout_RAX;
      goto LAB_001c4e9e;
    }
    if ((0x400 < (long)destructor_00 - (long)pCVar7) ||
       (pCVar5 = (CleanupNode *)pSVar6->limit_, pCVar5 <= destructor_00)) {
LAB_001c4d92:
      pSVar6->prefetch_ptr_ = (char *)destructor_00;
      return elem;
    }
    if (pCVar7 < destructor_00) {
      pCVar7 = destructor_00;
    }
    psVar8 = psVar14;
    if (pCVar7 != (CleanupNode *)0x0) {
      if (pCVar7 + 0x40 < pCVar5) {
        pCVar5 = pCVar7 + 0x40;
      }
      for (; destructor_00 = pCVar7, pCVar7 < pCVar5; pCVar7 = pCVar7 + 4) {
      }
      goto LAB_001c4d92;
    }
  }
  this_00 = (ThreadSafeArena *)&stack0xffffffffffffffc0;
  pCStack_50 = (CleanupNode *)0x1c4ebf;
  AllocateAlignedWithCleanup(this_00);
  pSStack_78 = pSVar6;
  sStack_70 = align;
  uStack_68 = n;
  psStack_60 = elem;
  p_Stack_58 = destructor;
  pCStack_50 = pCVar7;
  pSVar6 = GetSerialArenaFallback(this_00,(size_t)(psVar8 + 0x10));
  AVar4 = ArenaAlignAs(align_00);
  pcVar2 = (pSVar6->ptr_)._M_b._M_p;
  if (((ulong)pcVar2 & 7) != 0) {
    __assert_fail("false && \"ArenaAlignDefault::IsAligned(ptr)\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/arena_align.h"
                  ,0x90,
                  "auto google::protobuf::internal::ArenaAlign::CeilDefaultAligned(char *)::(anonymous class)::operator()() const"
                 );
  }
  pvVar16 = (void *)(-AVar4.align & (ulong)(pcVar2 + (AVar4.align - 1)));
  pAVar1 = (__pointer_type)((long)pvVar16 + ((ulong)(psVar8 + 7) & 0xfffffffffffffff8));
  if ((__pointer_type)pSVar6->limit_ < pAVar1) {
    pvVar16 = SerialArena::AllocateAlignedWithCleanupFallback
                        (pSVar6,(ulong)(psVar8 + 7) & 0xfffffffffffffff8,align_00,
                         (_func_void_void_ptr *)destructor_00);
    return pvVar16;
  }
  (pSVar6->ptr_)._M_b._M_p = (__pointer_type)pAVar1;
  pCVar7 = (pSVar6->cleanup_list_).next_;
  if (pCVar7 < (pSVar6->cleanup_list_).limit_) {
    (pSVar6->cleanup_list_).next_ = pCVar7 + 1;
    pCVar7->elem = pvVar16;
    pCVar7->destructor = (_func_void_void_ptr *)destructor_00;
  }
  else {
    cleanup::ChunkList::AddFallback
              (&pSVar6->cleanup_list_,pvVar16,(_func_void_void_ptr *)destructor_00,pSVar6);
  }
  pCVar7 = (CleanupNode *)(pSVar6->cleanup_list_).prefetch_ptr_;
  if ((pCVar7 != (CleanupNode *)0x0) && (pCVar7 < (CleanupNode *)(pSVar6->cleanup_list_).head_)) {
    pcVar15 = 
    "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
    ;
    uVar11 = 0x90;
    uVar12 = 0x137;
    goto LAB_001c50ed;
  }
  pCVar5 = (pSVar6->cleanup_list_).next_;
  if (((long)pCVar7 - (long)pCVar5 < 0x181) &&
     (pCVar10 = (pSVar6->cleanup_list_).limit_, pCVar7 < pCVar10)) {
    if (pCVar5 < pCVar7) {
      pCVar5 = pCVar7;
    }
    pCVar7 = pCVar5;
    if (pCVar7 != (CleanupNode *)0x0) {
      if (pCVar7 + 0x18 < pCVar10) {
        pCVar10 = pCVar7 + 0x18;
      }
      for (; pCVar7 < pCVar10; pCVar7 = pCVar7 + 4) {
      }
      goto LAB_001c4f68;
    }
  }
  else {
LAB_001c4f68:
    (pSVar6->cleanup_list_).prefetch_ptr_ = (char *)pCVar7;
    pcVar15 = (pSVar6->ptr_)._M_b._M_p;
    if (pSVar6->limit_ < pcVar15) {
      psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<char_const*,char_const*>
                         (pSVar6->limit_,pcVar15,"limit_ >= ptr()");
    }
    else {
      psVar8 = (string *)0x0;
    }
    if (psVar8 != (string *)0x0) {
      pcVar15 = *(char **)psVar8;
      uVar11 = *(undefined8 *)(psVar8 + 8);
      uVar12 = 0xf3;
      goto LAB_001c50ed;
    }
    pAVar13 = (__pointer_type)pSVar6->prefetch_ptr_;
    if ((pAVar13 != (__pointer_type)0x0) && (pAVar13 < (pSVar6->head_)._M_b._M_p)) {
      pcVar15 = 
      "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
      ;
      uVar11 = 0x67;
      uVar12 = 0x12e;
      goto LAB_001c50ed;
    }
    if ((0x400 < (long)pAVar13 - (long)pAVar1) ||
       (pAVar9 = (__pointer_type)pSVar6->limit_, pAVar9 <= pAVar13)) {
LAB_001c4fb2:
      pSVar6->prefetch_ptr_ = (char *)pAVar13;
      return pvVar16;
    }
    if (pAVar1 < pAVar13) {
      pAVar1 = pAVar13;
    }
    pAVar13 = pAVar1;
    if (pAVar13 != (__pointer_type)0x0) {
      if (pAVar13 + 0x40 < pAVar9) {
        pAVar9 = pAVar13 + 0x40;
      }
      for (; pAVar13 < pAVar9; pAVar13 = pAVar13 + 4) {
      }
      goto LAB_001c4fb2;
    }
  }
  pcVar15 = "prefetch_ptr != nullptr";
  uVar11 = 0x17;
  uVar12 = 0x123;
LAB_001c50ed:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_88,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
             ,uVar12,uVar11,pcVar15);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_88);
}

Assistant:

void* ThreadSafeArena::AllocateAlignedWithCleanup(size_t n, size_t align,
                                                  void (*destructor)(void*)) {
  SerialArena* arena;
  if (PROTOBUF_PREDICT_TRUE(GetSerialArenaFast(&arena))) {
    return arena->AllocateAlignedWithCleanup(n, align, destructor);
  } else {
    return AllocateAlignedWithCleanupFallback(n, align, destructor);
  }
}